

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icupkg.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  byte bVar3;
  char cVar4;
  UBool UVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int32_t iVar9;
  int32_t iVar10;
  char *pname;
  Package *this;
  char *filesPath;
  size_t sVar11;
  undefined7 extraout_var;
  Package *pPVar12;
  Package *pPVar13;
  Package *pPVar14;
  FileStream *fileStream;
  Item *pIVar15;
  undefined8 extraout_RAX;
  void *pvVar16;
  char *filesPath_00;
  char *outComment;
  char *__s1;
  byte bVar17;
  bool bVar18;
  char suffix [6];
  char outFilenameBuffer [1024];
  int local_458;
  char *local_450;
  undefined8 local_440;
  char local_438 [1032];
  
  pname = findBasename(*argv);
  uVar7 = u_parseArgs(argc,argv,0x11,options);
  if (options[1].doesOccur == '\0' && options[0].doesOccur == '\0') {
    this = (Package *)operator_new(0x31218);
    icu_63::Package::Package(this);
    bVar17 = options[0xe].doesOccur != '\0';
    if ((bool)bVar17) {
      this->doAutoPrefix = '\x01';
    }
    if (options[0xf].doesOccur == '\0') {
LAB_001e6417:
      if ((0xfffffffd < uVar7 - 4) && (bVar17 < 2)) {
        filesPath_00 = (char *)0x0;
        if (options[5].doesOccur != '\0') {
          filesPath_00 = options[5].value;
        }
        filesPath = (char *)0x0;
        if (options[6].doesOccur != '\0') {
          filesPath = options[6].value;
        }
        __s1 = argv[1];
        iVar8 = strcmp(__s1,"new");
        if (iVar8 == 0) {
          if (bVar17 != 0) {
            main_cold_2();
            goto LAB_001e6a28;
          }
          __s1 = (char *)0x0;
LAB_001e64ea:
          if (uVar7 < 3) {
            bVar2 = false;
            bVar18 = false;
            local_450 = (char *)0x0;
            bVar1 = false;
            if (options[2].doesOccur != '\0') goto LAB_001e653a;
LAB_001e6590:
            cVar4 = icu_63::Package::getInType(this);
            pvVar16 = (void *)(CONCAT71(extraout_var,cVar4) & 0xffffffff);
LAB_001e659a:
            bVar1 = true;
            if (options[7].doesOccur == '\0') {
              bVar1 = bVar18;
            }
            outComment = (char *)0x0;
            if (options[3].doesOccur != '\0') {
              outComment = 
              " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
              ;
            }
            if (options[4].doesOccur != '\0') {
              outComment = options[4].value;
            }
            if (options[8].doesOccur != '\0') {
              iVar8 = strcmp(options[8].value,"noslash");
              if (iVar8 != 0) goto LAB_001e6a21;
              icu_63::Package::setMatchMode(this,1);
            }
            local_440 = pvVar16;
            if (options[10].doesOccur != '\0') {
              pPVar12 = (Package *)operator_new(0x31218);
              icu_63::Package::Package(pPVar12);
              pPVar13 = readList((char *)0x0,options[10].value,'\0',pPVar12);
              if (pPVar13 == (Package *)0x0) goto LAB_001e6a21;
              icu_63::Package::removeItems(this,pPVar12);
              icu_63::Package::~Package(pPVar12);
              operator_delete(pPVar12);
              bVar1 = true;
            }
            if (options[9].doesOccur == '\0') {
              pPVar12 = (Package *)0x0;
            }
            else {
              pPVar12 = (Package *)operator_new(0x31218);
              icu_63::Package::Package(pPVar12);
              pPVar13 = readList(filesPath_00,options[9].value,'\x01',pPVar12);
              if (pPVar13 == (Package *)0x0) {
                fprintf(_stderr,
                        "%csage: %s [-h|-?|--help ] [-tl|-tb|-te] [-c] [-C comment]\n\t[-a list] [-r list] [-x list] [-l [-o outputListFileName]]\n\t[-s path] [-d path] [-w] [-m mode]\n\t[--auto_toc_prefix] [--auto_toc_prefix_with_type] [--toc_prefix]\n\tinfilename [outfilename]\n"
                        ,0x75,pname);
                return 1;
              }
              icu_63::Package::addItems(this,pPVar12);
              bVar1 = true;
            }
            pvVar16 = local_440;
            if (options[0xb].doesOccur != '\0') {
              pPVar13 = (Package *)operator_new(0x31218);
              icu_63::Package::Package(pPVar13);
              pPVar14 = readList((char *)0x0,options[0xb].value,'\0',pPVar13);
              if (pPVar14 == (Package *)0x0) goto LAB_001e6a21;
              icu_63::Package::extractItems(this,filesPath,pPVar13,(char)pvVar16);
              icu_63::Package::~Package(pPVar13);
              operator_delete(pPVar13);
            }
            if (options[0xc].doesOccur == '\0') {
LAB_001e68db:
              UVar5 = icu_63::Package::checkDependencies(this);
              pvVar16 = local_440;
              if (UVar5 == '\0') {
                return 2;
              }
              if (bVar1) {
                cVar4 = (char)local_440;
                if ((local_450 == (char *)0x0) || (*local_450 == '\0')) {
                  if ((__s1 == (char *)0x0) || (*__s1 == '\0')) {
                    main_cold_3();
                    operator_delete(pvVar16);
                    _Unwind_Resume(extraout_RAX);
                  }
                  cVar6 = icu_63::Package::getInType(this);
                  local_458 = CONCAT31(0x61642e,cVar6);
                  local_450 = local_438;
                  strcpy(local_450,__s1);
                  sVar11 = strlen(local_450);
                  if ((5 < (long)sVar11) &&
                     (local_438[sVar11 - 1] == 't' &&
                      *(int *)(local_438 + (sVar11 - 5)) == local_458)) {
                    local_438[sVar11 - 5] = cVar4;
                  }
                }
                if (options[0x10].doesOccur != '\0') {
                  icu_63::Package::setPrefix(this,options[0x10].value);
                }
                iVar8 = writePackageDatFile(local_450,outComment,(char *)0x0,(char *)0x0,this,cVar4)
                ;
              }
              else {
                iVar8 = 0;
              }
              if (pPVar12 != (Package *)0x0) {
                icu_63::Package::~Package(pPVar12);
              }
              operator_delete(pPVar12);
              icu_63::Package::~Package(this);
              operator_delete(this);
              return iVar8;
            }
            if (options[0xd].doesOccur == '\0') {
              iVar9 = icu_63::Package::getItemCount(this);
              if (0 < iVar9) {
                iVar9 = 0;
                do {
                  __stream = _stdout;
                  pIVar15 = icu_63::Package::getItem(this,iVar9);
                  fprintf(__stream,"%s\n",pIVar15->name);
                  iVar9 = iVar9 + 1;
                  iVar10 = icu_63::Package::getItemCount(this);
                } while (iVar9 < iVar10);
              }
              goto LAB_001e68db;
            }
            fileStream = T_FileStream_open(options[0xd].value,"w");
            if (fileStream != (FileStream *)0x0) {
              iVar9 = icu_63::Package::getItemCount(this);
              if (0 < iVar9) {
                iVar9 = 0;
                do {
                  pIVar15 = icu_63::Package::getItem(this,iVar9);
                  T_FileStream_writeLine(fileStream,pIVar15->name);
                  T_FileStream_writeLine(fileStream,"\n");
                  iVar9 = iVar9 + 1;
                  iVar10 = icu_63::Package::getItemCount(this);
                } while (iVar9 < iVar10);
              }
              T_FileStream_close(fileStream);
              goto LAB_001e68db;
            }
            goto LAB_001e6a28;
          }
          bVar1 = false;
LAB_001e64f2:
          local_450 = argv[2];
          iVar8 = strcmp(argv[1],local_450);
          bVar18 = iVar8 != 0;
          bVar2 = bVar18;
          if (options[2].doesOccur == '\0') {
            if (!bVar1) goto LAB_001e6590;
            goto LAB_001e67de;
          }
LAB_001e653a:
          bVar17 = *options[2].value;
          pvVar16 = (void *)(ulong)bVar17;
          if ((((bVar17 == 0) || (options[2].value[1] != '\0')) || (10 < bVar17 - 0x62)) ||
             ((0x409U >> (bVar17 - 0x62 & 0x1f) & 1) == 0)) goto LAB_001e6a21;
          if (!bVar1) {
            bVar3 = icu_63::Package::getInType(this);
            bVar18 = (bool)(bVar2 | bVar17 != bVar3);
            goto LAB_001e659a;
          }
          bVar18 = false;
        }
        else {
          sVar11 = strlen(__s1);
          if ((4 < (int)sVar11) && (iVar8 = strcmp(__s1 + ((int)sVar11 - 4),".dat"), iVar8 == 0)) {
            icu_63::Package::readPackage(this,__s1);
            goto LAB_001e64ea;
          }
          icu_63::Package::addFile(this,filesPath_00,__s1);
          bVar1 = true;
          if (2 < uVar7) goto LAB_001e64f2;
          bVar18 = filesPath_00 != filesPath;
          local_450 = __s1;
          if (options[2].doesOccur != '\0') {
            bVar1 = true;
            bVar2 = bVar18;
            goto LAB_001e653a;
          }
LAB_001e67de:
          bVar18 = (bool)((bVar18 ^ 1U) & options[7].doesOccur == '\0');
          bVar17 = 0;
        }
        if (((((options[4].doesOccur == '\0') && (options[3].doesOccur == '\0')) &&
             (options[8].doesOccur == '\0')) &&
            ((options[10].doesOccur == '\0' && (options[9].doesOccur == '\0')))) &&
           ((options[0xb].doesOccur == '\0' && (options[0xc].doesOccur == '\0')))) {
          if (!bVar18) {
            icu_63::Package::extractItem(this,filesPath,local_450,0,bVar17);
          }
          icu_63::Package::~Package(this);
          operator_delete(this);
          goto LAB_001e687d;
        }
      }
LAB_001e6a21:
      fprintf(_stderr,
              "%csage: %s [-h|-?|--help ] [-tl|-tb|-te] [-c] [-C comment]\n\t[-a list] [-r list] [-x list] [-l [-o outputListFileName]]\n\t[-s path] [-d path] [-w] [-m mode]\n\t[--auto_toc_prefix] [--auto_toc_prefix_with_type] [--toc_prefix]\n\tinfilename [outfilename]\n"
              ,0x75,pname);
    }
    else {
      if (options[0x10].doesOccur == '\0') {
        this->doAutoPrefix = '\x01';
        this->prefixEndsWithType = '\x01';
        bVar17 = bVar17 + 1;
        goto LAB_001e6417;
      }
      main_cold_1();
    }
LAB_001e6a28:
    iVar8 = 1;
  }
  else {
    printUsage(pname,'\x01');
LAB_001e687d:
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

extern int
main(int argc, char *argv[]) {
    const char *pname, *sourcePath, *destPath, *inFilename, *outFilename, *outComment;
    char outType;
    UBool isHelp, isModified, isPackage;
    int result = 0;

    Package *pkg, *listPkg, *addListPkg;

    U_MAIN_INIT_ARGS(argc, argv);

    /* get the program basename */
    pname=findBasename(argv[0]);

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    isHelp=options[OPT_HELP_H].doesOccur || options[OPT_HELP_QUESTION_MARK].doesOccur;
    if(isHelp) {
        printUsage(pname, TRUE);
        return U_ZERO_ERROR;
    }

    pkg=new Package;
    if(pkg==NULL) {
        fprintf(stderr, "icupkg: not enough memory\n");
        return U_MEMORY_ALLOCATION_ERROR;
    }
    isModified=FALSE;

    int autoPrefix=0;
    if(options[OPT_AUTO_TOC_PREFIX].doesOccur) {
        pkg->setAutoPrefix();
        ++autoPrefix;
    }
    if(options[OPT_AUTO_TOC_PREFIX_WITH_TYPE].doesOccur) {
        if(options[OPT_TOC_PREFIX].doesOccur) {
            fprintf(stderr, "icupkg: --auto_toc_prefix_with_type and also --toc_prefix\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        pkg->setAutoPrefixWithType();
        ++autoPrefix;
    }
    if(argc<2 || 3<argc || autoPrefix>1) {
        printUsage(pname, FALSE);
        return U_ILLEGAL_ARGUMENT_ERROR;
    }

    if(options[OPT_SOURCEDIR].doesOccur) {
        sourcePath=options[OPT_SOURCEDIR].value;
    } else {
        // work relative to the current working directory
        sourcePath=NULL;
    }
    if(options[OPT_DESTDIR].doesOccur) {
        destPath=options[OPT_DESTDIR].value;
    } else {
        // work relative to the current working directory
        destPath=NULL;
    }

    if(0==strcmp(argv[1], "new")) {
        if(autoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but no input package\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        inFilename=NULL;
        isPackage=TRUE;
    } else {
        inFilename=argv[1];
        if(isPackageName(inFilename)) {
            pkg->readPackage(inFilename);
            isPackage=TRUE;
        } else {
            /* swap a single file (icuswap replacement) rather than work on a package */
            pkg->addFile(sourcePath, inFilename);
            isPackage=FALSE;
        }
    }

    if(argc>=3) {
        outFilename=argv[2];
        if(0!=strcmp(argv[1], argv[2])) {
            isModified=TRUE;
        }
    } else if(isPackage) {
        outFilename=NULL;
    } else /* !isPackage */ {
        outFilename=inFilename;
        isModified=(UBool)(sourcePath!=destPath);
    }

    /* parse the output type option */
    if(options[OPT_OUT_TYPE].doesOccur) {
        const char *type=options[OPT_OUT_TYPE].value;
        if(type[0]==0 || type[1]!=0) {
            /* the type must be exactly one letter */
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        outType=type[0];
        switch(outType) {
        case 'l':
        case 'b':
        case 'e':
            break;
        default:
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }

        /*
         * Set the isModified flag if the output type differs from the
         * input package type.
         * If we swap a single file, just assume that we are modifying it.
         * The Package class does not give us access to the item and its type.
         */
        isModified|=(UBool)(!isPackage || outType!=pkg->getInType());
    } else if(isPackage) {
        outType=pkg->getInType(); // default to input type
    } else /* !isPackage: swap single file */ {
        outType=0; /* tells extractItem() to not swap */
    }

    if(options[OPT_WRITEPKG].doesOccur) {
        isModified=TRUE;
    }

    if(!isPackage) {
        /*
         * icuswap tool replacement: Only swap a single file.
         * Check that irrelevant options are not set.
         */
        if( options[OPT_COMMENT].doesOccur ||
            options[OPT_COPYRIGHT].doesOccur ||
            options[OPT_MATCHMODE].doesOccur ||
            options[OPT_REMOVE_LIST].doesOccur ||
            options[OPT_ADD_LIST].doesOccur ||
            options[OPT_EXTRACT_LIST].doesOccur ||
            options[OPT_LIST_ITEMS].doesOccur
        ) {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        if(isModified) {
            pkg->extractItem(destPath, outFilename, 0, outType);
        }

        delete pkg;
        return result;
    }

    /* Work with a package. */

    if(options[OPT_COMMENT].doesOccur) {
        outComment=options[OPT_COMMENT].value;
    } else if(options[OPT_COPYRIGHT].doesOccur) {
        outComment=U_COPYRIGHT_STRING;
    } else {
        outComment=NULL;
    }

    if(options[OPT_MATCHMODE].doesOccur) {
        if(0==strcmp(options[OPT_MATCHMODE].value, "noslash")) {
            pkg->setMatchMode(Package::MATCH_NOSLASH);
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* remove items */
    if(options[OPT_REMOVE_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_REMOVE_LIST].value, FALSE, listPkg)) {
            pkg->removeItems(*listPkg);
            delete listPkg;
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /*
     * add items
     * use a separate Package so that its memory and items stay around
     * as long as the main Package
     */
    addListPkg=NULL;
    if(options[OPT_ADD_LIST].doesOccur) {
        addListPkg=new Package();
        if(addListPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(sourcePath, options[OPT_ADD_LIST].value, TRUE, addListPkg)) {
            pkg->addItems(*addListPkg);
            // delete addListPkg; deferred until after writePackage()
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* extract items */
    if(options[OPT_EXTRACT_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_EXTRACT_LIST].value, FALSE, listPkg)) {
            pkg->extractItems(destPath, *listPkg, outType);
            delete listPkg;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* list items */
    if(options[OPT_LIST_ITEMS].doesOccur) {
        int32_t i;
        if (options[OPT_LIST_FILE].doesOccur) {
            FileStream *out;
            out = T_FileStream_open(options[OPT_LIST_FILE].value, "w");
            if (out != NULL) {
                for(i=0; i<pkg->getItemCount(); ++i) {
                    T_FileStream_writeLine(out, pkg->getItem(i)->name);
                    T_FileStream_writeLine(out, "\n");
                }
                T_FileStream_close(out);
            } else {
                return U_ILLEGAL_ARGUMENT_ERROR;
            }
        } else {
            for(i=0; i<pkg->getItemCount(); ++i) {
                fprintf(stdout, "%s\n", pkg->getItem(i)->name);
            }
        }
    }

    /* check dependencies between items */
    if(!pkg->checkDependencies()) {
        /* some dependencies are not fulfilled */
        return U_MISSING_RESOURCE_ERROR;
    }

    /* write the output .dat package if there are any modifications */
    if(isModified) {
        char outFilenameBuffer[1024]; // for auto-generated output filename, if necessary

        if(outFilename==NULL || outFilename[0]==0) {
            if(inFilename==NULL || inFilename[0]==0) {
                fprintf(stderr, "icupkg: unable to auto-generate an output filename if there is no input filename\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }

            /*
             * auto-generate a filename:
             * copy the inFilename,
             * and if the last basename character matches the input file's type,
             * then replace it with the output file's type
             */
            char suffix[6]="?.dat";
            char *s;

            suffix[0]=pkg->getInType();
            strcpy(outFilenameBuffer, inFilename);
            s=strchr(outFilenameBuffer, 0);
            if((s-outFilenameBuffer)>5 && 0==memcmp(s-5, suffix, 5)) {
                *(s-5)=outType;
            }
            outFilename=outFilenameBuffer;
        }
        if(options[OPT_TOC_PREFIX].doesOccur) {
            pkg->setPrefix(options[OPT_TOC_PREFIX].value);
        }
        result = writePackageDatFile(outFilename, outComment, NULL, NULL, pkg, outType);
    }

    delete addListPkg;
    delete pkg;
    return result;
}